

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tables.c
# Opt level: O1

int main(void)

{
  amqp_field_value_t v;
  amqp_field_value_t v_00;
  amqp_field_value_t v_01;
  amqp_field_value_t v_02;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  char *pcVar4;
  FILE *__s;
  size_t sVar5;
  size_t sVar6;
  FILE *__s_00;
  FILE *__stream;
  size_t sVar7;
  int *piVar8;
  long lVar9;
  FILE *__stream_00;
  char *pcVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  undefined4 uVar14;
  amqp_bytes_t encoded;
  amqp_bytes_t encoded_00;
  amqp_table_t table;
  amqp_table_t decoded;
  size_t decoding_offset;
  amqp_pool_t pool;
  amqp_field_value_t val;
  char f2_buf [4096];
  byte in_stack_ffffffffffffdec0;
  byte in_stack_ffffffffffffdec8;
  undefined1 in_stack_ffffffffffffdec9;
  undefined2 in_stack_ffffffffffffdeca;
  uint in_stack_ffffffffffffdecc;
  amqp_field_value_t *paStack_2130;
  amqp_table_t local_2120;
  amqp_table_t local_2110;
  size_t local_2100;
  amqp_pool_t local_20f8;
  undefined1 local_20b8 [8];
  undefined4 local_20b0;
  undefined1 local_20a0;
  undefined8 local_2098;
  char *local_2090;
  undefined8 local_2088;
  char *local_2080;
  undefined1 local_2078;
  undefined4 local_2070;
  undefined8 local_2060;
  char *local_2058;
  undefined1 local_2050;
  undefined8 local_2048;
  char *local_2040;
  undefined8 local_2038;
  char *pcStack_2030;
  amqp_table_entry_t_ *paStack_2028;
  undefined8 local_2020;
  char *local_2018;
  undefined8 local_2010;
  char *local_2008;
  undefined1 local_2000;
  undefined8 local_1ff8;
  char *local_1ff0;
  undefined8 local_1fe8;
  char *local_1fe0;
  undefined1 local_1fd8;
  undefined8 local_1fd0;
  char *local_1fc8;
  undefined8 local_1fc0;
  char *local_1fb8;
  undefined1 local_1fb0;
  undefined4 local_1fa8;
  undefined8 local_1f98;
  char *local_1f90;
  undefined1 local_1f88;
  undefined1 local_1f80;
  undefined4 local_1f7c;
  undefined8 local_1f70;
  char *local_1f68;
  undefined1 local_1f60;
  undefined8 local_1f58;
  undefined8 local_1f48;
  char *local_1f40;
  undefined1 local_1f38;
  undefined8 local_1f30;
  char *local_1f28;
  undefined8 local_1f20;
  char *local_1f18;
  undefined1 local_1f10;
  undefined8 local_1f08;
  char *local_1f00;
  undefined1 local_1038 [136];
  undefined1 local_fb0;
  __off64_t local_fa8;
  void *local_f98;
  char *local_f90;
  undefined1 local_f88;
  undefined4 local_f80;
  undefined8 *local_f78;
  char local_f70 [8];
  char *local_f68;
  undefined1 local_f60;
  undefined1 local_f58;
  undefined8 local_f48;
  char *local_f40;
  undefined1 local_f38;
  undefined8 local_f30;
  undefined8 local_f20;
  char *local_f18;
  undefined1 local_f10;
  undefined2 local_f08;
  undefined8 local_ef8;
  char *local_ef0;
  undefined1 local_ee8;
  undefined4 local_ee0;
  undefined8 local_ed0;
  char *local_ec8;
  undefined1 local_ec0;
  undefined8 local_eb8;
  char *local_eb0;
  undefined8 local_ea8;
  char *local_ea0;
  undefined1 local_e98;
  undefined8 local_e80;
  char *local_e78;
  undefined1 local_e70;
  undefined4 local_e68;
  undefined1 *local_e60;
  undefined8 local_e58;
  char *local_e50;
  undefined1 local_e48;
  undefined4 local_e40;
  undefined8 local_e30;
  char *local_e28;
  undefined1 local_e20;
  undefined8 local_e18;
  
  pcVar4 = getenv("srcdir");
  __s = tmpfile();
  if (__s == (FILE *)0x0) {
    piVar8 = __errno_location();
    pcVar4 = strerror(*piVar8);
    pcVar10 = "failed to create temporary file: %s";
LAB_00102bf6:
    die(pcVar10,pcVar4);
LAB_00102c00:
    pcVar4 = "Offset should be %ld, was %ld";
    __stream_00 = (FILE *)0x103;
LAB_00102c42:
    die(pcVar4);
LAB_00102c49:
    pcVar4 = "output file did not have expected contents";
  }
  else {
    local_f78 = &local_2088;
    local_2088 = 3;
    local_2080 = "one";
    local_2078 = 0x49;
    local_2070 = 0xd431;
    local_2060 = 3;
    local_2058 = "two";
    local_2050 = 0x53;
    local_2048 = 0xd;
    local_2040 = "A long string";
    local_e60 = local_20b8;
    local_20b8[0] = 0x49;
    local_20b0 = 0xd431;
    local_20a0 = 0x53;
    local_2098 = 0xd;
    local_2090 = "A long string";
    local_2120.entries = (amqp_table_entry_t_ *)local_1038;
    local_1038._0_8_ = 7;
    local_1038._8_8_ = "longstr";
    local_1038[0x10] = 0x53;
    local_1038._24_8_ = (char *)0x15;
    local_1038._32_8_ = "Here is a long string";
    local_1038._40_8_ = (char *)0x9;
    local_1038._48_8_ = "signedint";
    local_1038[0x38] = 0x49;
    local_1038._64_4_ = 0x3039;
    local_1038._80_8_ = (char *)0x7;
    local_1038._88_8_ = "decimal";
    local_1038[0x60] = 0x44;
    local_1038[0x68] = 3;
    local_1038._108_4_ = 0x1e240;
    local_1038._120_8_ = 9;
    local_1038._128_8_ = "timestamp";
    local_fb0 = 0x54;
    local_fa8 = 0x63eea053c194;
    local_f98 = (void *)0x5;
    local_f90 = "table";
    local_f88 = 0x46;
    local_f80 = 2;
    local_f70[0] = '\x04';
    local_f70[1] = '\0';
    local_f70[2] = '\0';
    local_f70[3] = '\0';
    local_f70[4] = '\0';
    local_f70[5] = '\0';
    local_f70[6] = '\0';
    local_f70[7] = '\0';
    local_f68 = "byte";
    local_f60 = 0x62;
    local_f58 = 0xff;
    local_f48 = 4;
    local_f40 = "long";
    local_f38 = 0x6c;
    local_f30 = 0x499602d2;
    local_f20 = 5;
    local_f18 = "short";
    local_f10 = 0x73;
    local_f08 = 0x28f;
    local_ef8 = 4;
    local_ef0 = "bool";
    local_ee8 = 0x74;
    local_ee0 = 1;
    local_ed0 = 6;
    local_ec8 = "binary";
    local_ec0 = 0x78;
    local_eb8 = 0xf;
    local_eb0 = "a binary string";
    local_ea8 = 4;
    local_ea0 = "void";
    local_e98 = 0x56;
    local_e80 = 5;
    local_e78 = "array";
    local_e70 = 0x41;
    local_e68 = 2;
    local_e58 = 5;
    local_e50 = "float";
    local_e48 = 0x66;
    local_e40 = 0x40490fdb;
    local_e30 = 6;
    local_e28 = "double";
    local_e20 = 100;
    local_e18 = 0x400921fb54442d18;
    local_2120.num_entries = 0xe;
    fwrite("AAAAAAAAAA\n",0xb,1,__s);
    local_2038 = CONCAT71(local_2038._1_7_,0x46);
    pcStack_2030 = (char *)CONCAT44(local_2120._4_4_,local_2120.num_entries);
    paStack_2028 = local_2120.entries;
    in_stack_ffffffffffffdec8 = (byte)local_2120.entries;
    in_stack_ffffffffffffdec9 = (undefined1)((ulong)local_2120.entries >> 8);
    in_stack_ffffffffffffdeca = (undefined2)((ulong)local_2120.entries >> 0x10);
    in_stack_ffffffffffffdecc = (uint)((ulong)local_2120.entries >> 0x20);
    in_stack_ffffffffffffdec0 = (byte)local_2120.num_entries;
    v_00.value.i8 = in_stack_ffffffffffffdec0;
    v_00._0_8_ = local_2038;
    v_00.value.i64._1_7_ = (int7)((ulong)pcStack_2030 >> 8);
    v_00.value._8_1_ = in_stack_ffffffffffffdec8;
    v_00.value._9_1_ = in_stack_ffffffffffffdec9;
    v_00.value._10_2_ = in_stack_ffffffffffffdeca;
    v_00.value._12_4_ = in_stack_ffffffffffffdecc;
    dump_value(0,v_00,(FILE *)__s);
    init_amqp_pool(&local_20f8,0x1000);
    local_2100 = 0;
    encoded.bytes = pre_encoded_table;
    encoded.len = 0x103;
    iVar2 = amqp_decode_table(encoded,&local_20f8,&local_2110,&local_2100);
    if (iVar2 < 0) {
      pcVar4 = amqp_error_string2(iVar2);
      pcVar10 = "Table decoding failed: %s";
      goto LAB_00102bf6;
    }
    fwrite("BBBBBBBBBB\n",0xb,1,__s);
    local_2038 = CONCAT71(local_2038._1_7_,0x46);
    pcStack_2030 = (char *)local_2110._0_8_;
    paStack_2028 = local_2110.entries;
    in_stack_ffffffffffffdec8 = (byte)local_2110.entries;
    in_stack_ffffffffffffdec9 = (undefined1)((ulong)local_2110.entries >> 8);
    in_stack_ffffffffffffdeca = (undefined2)((ulong)local_2110.entries >> 0x10);
    in_stack_ffffffffffffdecc = (uint)((ulong)local_2110.entries >> 0x20);
    in_stack_ffffffffffffdec0 = (byte)local_2110.num_entries;
    v_01.value.i8 = in_stack_ffffffffffffdec0;
    v_01._0_8_ = local_2038;
    v_01.value.i64._1_7_ = local_2110._1_7_;
    v_01.value._8_1_ = in_stack_ffffffffffffdec8;
    v_01.value._9_1_ = in_stack_ffffffffffffdec9;
    v_01.value._10_2_ = in_stack_ffffffffffffdeca;
    v_01.value._12_4_ = in_stack_ffffffffffffdecc;
    dump_value(0,v_01,(FILE *)__s);
    local_2110._0_8_ = (char *)0x0;
    memset(&local_2038,0,0x1000);
    encoded_00.bytes = &local_2038;
    encoded_00.len = 0x1000;
    iVar2 = amqp_encode_table(encoded_00,&local_2120,(size_t *)&local_2110);
    if (iVar2 < 0) {
      pcVar4 = amqp_error_string2(iVar2);
      pcVar10 = "Table encoding failed: %s";
      goto LAB_00102bf6;
    }
    if ((char *)local_2110._0_8_ != (char *)0x103) goto LAB_00102c00;
    uVar3 = memcmp(pre_encoded_table,&local_2038,0x103);
    if (uVar3 == 0) {
      empty_amqp_pool(&local_20f8);
      fwrite("----------\n",0xb,1,__s);
      local_2038 = 5;
      pcStack_2030 = "zebra";
      paStack_2028 = (amqp_table_entry_t_ *)CONCAT71(paStack_2028._1_7_,0x53);
      local_2020 = 4;
      local_2018 = "last";
      local_2010 = 8;
      local_2008 = "aardvark";
      local_2000 = 0x53;
      local_1ff8 = 5;
      local_1ff0 = "first";
      local_1fe8 = 6;
      local_1fe0 = "middle";
      local_1fd8 = 0x53;
      local_1fd0 = 5;
      local_1fc8 = "third";
      local_1fc0 = 6;
      local_1fb8 = "number";
      local_1fb0 = 0x49;
      local_1fa8 = 0x4d2;
      local_1f98 = 7;
      local_1f90 = "decimal";
      local_1f88 = 0x44;
      local_1f80 = 2;
      local_1f7c = 0x4d2;
      local_1f70 = 4;
      local_1f68 = "time";
      local_1f60 = 0x54;
      local_1f58 = 0x4626dbf9a01f2;
      local_1f48 = 4;
      local_1f40 = "beta";
      local_1f38 = 0x53;
      local_1f30 = 6;
      local_1f28 = "second";
      local_1f20 = 6;
      local_1f18 = "wombat";
      local_1f10 = 0x53;
      local_1f08 = 6;
      local_1f00 = "fourth";
      qsort(&local_2038,8,0x28,amqp_table_entry_cmp);
      local_1038[0] = 0x46;
      local_1038._8_4_ = 8;
      in_stack_ffffffffffffdec8 = (byte)&local_2038;
      in_stack_ffffffffffffdec9 = (undefined1)((ulong)&local_2038 >> 8);
      in_stack_ffffffffffffdeca = (undefined2)((ulong)&local_2038 >> 0x10);
      in_stack_ffffffffffffdecc = (uint)((ulong)&local_2038 >> 0x20);
      in_stack_ffffffffffffdec0 = 8;
      v_02.value.i8 = 8;
      v_02._0_8_ = local_1038._0_8_;
      v_02.value.i64._1_7_ = SUB87(local_1038._8_8_,1);
      v_02.value._8_1_ = in_stack_ffffffffffffdec8;
      v_02.value._9_1_ = in_stack_ffffffffffffdec9;
      v_02.value._10_2_ = in_stack_ffffffffffffdeca;
      v_02.value._12_4_ = in_stack_ffffffffffffdecc;
      __stream_00 = __s;
      local_1038._16_8_ = &local_2038;
      dump_value(0,v_02,(FILE *)__s);
      pcVar10 = ".";
      if (pcVar4 != (char *)0x0) {
        pcVar10 = pcVar4;
      }
      sVar5 = strlen(pcVar10);
      sVar6 = strlen(expected_file_name);
      __s_00 = (FILE *)malloc(sVar5 + sVar6 + 2);
      if (__s_00 == (FILE *)0x0) goto LAB_00102c1e;
      sprintf((char *)__s_00,"%s/%s",pcVar10,expected_file_name);
      __stream = fopen((char *)__s_00,"r");
      if (__stream == (FILE *)0x0) {
        piVar8 = __errno_location();
        strerror(*piVar8);
        pcVar4 = "failed to open %s: %s";
        __stream_00 = __s_00;
        goto LAB_00102c42;
      }
      rewind(__stream);
      rewind(__s);
      do {
        sVar6 = fread(&local_2038,1,0x1000,__stream);
        sVar7 = fread((FILE *)local_1038,1,0x1000,__s);
        sVar5 = sVar7;
        if (sVar6 < sVar7) {
          sVar5 = sVar6;
        }
        __stream_00 = (FILE *)local_1038;
        iVar2 = bcmp(&local_2038,(FILE *)local_1038,sVar5);
        if (iVar2 == 0) {
          bVar1 = sVar6 == sVar7 || 0xfff < sVar7 && 0xfff < sVar6;
        }
        else {
          bVar1 = false;
        }
      } while (iVar2 == 0 && (0xfff < sVar7 && 0xfff < sVar6));
      if (bVar1) {
        fclose(__stream);
        free(__s_00);
        fclose(__s);
        return 0;
      }
      goto LAB_00102c49;
    }
    __stream_00 = (FILE *)(ulong)uVar3;
    die("Table encoding differed");
LAB_00102c1e:
    pcVar4 = "out of memory";
  }
  die(pcVar4);
  iVar2 = (int)pcVar4;
  uVar12 = (ulong)pcVar4 & 0xffffffff;
  if (0 < iVar2) {
    do {
      fputc(0x20,__stream_00);
      uVar3 = (int)uVar12 - 1;
      uVar12 = (ulong)uVar3;
    } while (uVar3 != 0);
  }
  uVar3 = (uint)in_stack_ffffffffffffdec0;
  fputc(uVar3,__stream_00);
  if (in_stack_ffffffffffffdec0 < 0x56) {
    switch(uVar3) {
    case 0x41:
      iVar11 = fputc(10,__stream_00);
      lVar9 = (long)CONCAT22(in_stack_ffffffffffffdeca,
                             CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8));
      if (0 < lVar9) {
        do {
          dump_value(iVar2 + 2,*paStack_2130,(FILE *)__stream_00);
          paStack_2130 = paStack_2130 + 1;
          lVar9 = lVar9 + -1;
          iVar11 = extraout_EAX;
        } while (lVar9 != 0);
      }
      break;
    case 0x42:
      uVar12 = (ulong)in_stack_ffffffffffffdec8;
      goto LAB_00102f5f;
    case 0x44:
      iVar2 = fprintf(__stream_00," %u:::%u\n",(ulong)in_stack_ffffffffffffdec8,
                      (ulong)in_stack_ffffffffffffdecc);
      return iVar2;
    case 0x46:
      fputc(10,__stream_00);
      iVar11 = CONCAT22(in_stack_ffffffffffffdeca,
                        CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8));
      lVar9 = (long)iVar11;
      if (0 < lVar9) {
        lVar13 = 0;
        do {
          iVar11 = iVar2 + 2;
          if (-2 < iVar2) {
            do {
              fputc(0x20,__stream_00);
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          fprintf(__stream_00,"%.*s ->\n",(ulong)*(uint *)((long)paStack_2130 + lVar13 * 0x28),
                  *(undefined8 *)((long)paStack_2130 + lVar13 * 0x28 + 8));
          v.value.bytes.bytes = (void *)*(undefined8 *)((long)paStack_2130 + lVar13 * 0x28 + 0x20);
          v._0_16_ = *(undefined1 (*) [16])((long)paStack_2130 + lVar13 * 0x28 + 0x10);
          dump_value(iVar2 + 4,v,(FILE *)__stream_00);
          lVar13 = lVar13 + 1;
          iVar11 = extraout_EAX_00;
        } while (lVar13 != lVar9);
      }
      break;
    case 0x49:
      uVar12 = (ulong)CONCAT22(in_stack_ffffffffffffdeca,
                               CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8));
      goto LAB_00102f94;
    default:
      if (uVar3 == 0x53) {
        iVar2 = fprintf(__stream_00," %.*s\n",
                        (ulong)CONCAT22(in_stack_ffffffffffffdeca,
                                        CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8
                                                )),paStack_2130);
        return iVar2;
      }
      if (uVar3 == 0x54) {
        pcVar4 = " %lu\n";
        goto LAB_00102f0b;
      }
    case 0x43:
    case 0x45:
    case 0x47:
    case 0x48:
switchD_00102cb9_caseD_63:
      sVar5 = fwrite("???\n",4,1,__stream_00);
      return (int)sVar5;
    }
    return iVar11;
  }
  switch(uVar3) {
  case 0x62:
    uVar12 = (ulong)(uint)(int)(char)in_stack_ffffffffffffdec8;
    break;
  case 99:
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
    goto switchD_00102cb9_caseD_63;
  case 100:
    uVar14 = CONCAT22(in_stack_ffffffffffffdeca,
                      CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8));
    goto LAB_00102f6f;
  case 0x66:
    uVar14 = SUB84((double)(float)CONCAT22(in_stack_ffffffffffffdeca,
                                           CONCAT11(in_stack_ffffffffffffdec9,
                                                    in_stack_ffffffffffffdec8)),0);
LAB_00102f6f:
    iVar2 = fprintf(__stream_00," %g\n",uVar14);
    return iVar2;
  case 0x69:
    uVar12 = (ulong)CONCAT22(in_stack_ffffffffffffdeca,
                             CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8));
    goto LAB_00102f5f;
  case 0x6c:
    pcVar4 = " %ld\n";
LAB_00102f0b:
    iVar2 = fprintf(__stream_00,pcVar4,
                    CONCAT44(in_stack_ffffffffffffdecc,
                             CONCAT22(in_stack_ffffffffffffdeca,
                                      CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8))
                            ));
    return iVar2;
  case 0x73:
    uVar12 = (ulong)(uint)(int)CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8);
    break;
  case 0x74:
    pcVar4 = " true\n";
    if (CONCAT22(in_stack_ffffffffffffdeca,
                 CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8)) == 0) {
      pcVar4 = " false\n";
    }
    iVar2 = fputs(pcVar4,__stream_00);
    return iVar2;
  case 0x75:
    uVar12 = (ulong)CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8);
LAB_00102f5f:
    pcVar4 = " %u\n";
    goto LAB_00102f9b;
  default:
    if (uVar3 != 0x56) {
      if (uVar3 != 0x78) goto switchD_00102cb9_caseD_63;
      fputc(0x20,__stream_00);
      uVar3 = CONCAT22(in_stack_ffffffffffffdeca,
                       CONCAT11(in_stack_ffffffffffffdec9,in_stack_ffffffffffffdec8));
      if (0 < (int)uVar3) {
        uVar12 = 0;
        do {
          fprintf(__stream_00,"%02x",(ulong)(uint)(int)(char)(&paStack_2130->kind)[uVar12]);
          uVar12 = uVar12 + 1;
        } while ((uVar3 & 0x7fffffff) != uVar12);
      }
    }
    iVar2 = fputc(10,__stream_00);
    return iVar2;
  }
LAB_00102f94:
  pcVar4 = " %d\n";
LAB_00102f9b:
  iVar2 = fprintf(__stream_00,pcVar4,uVar12);
  return iVar2;
}

Assistant:

int main(void) {
  char *srcdir = getenv("srcdir");
  FILE *out, *expected = NULL;
  char *expected_path;

  out = tmpfile();
  if (out == NULL) {
    die("failed to create temporary file: %s", strerror(errno));
  }

  test_table_codec(out);
  fprintf(out, "----------\n");
  test_dump_value(out);

  if (srcdir == NULL) {
    srcdir = ".";
  }

  expected_path = malloc(strlen(srcdir) + strlen(expected_file_name) + 2);
  if (!expected_path) {
    die("out of memory");
  }
  sprintf(expected_path, "%s/%s", srcdir, expected_file_name);
  expected = fopen(expected_path, "r");
  if (!expected) {
    die("failed to open %s: %s", expected_path, strerror(errno));
  }

  if (compare_files(expected, out)) {
    die("output file did not have expected contents");
  }

  fclose(expected);
  free(expected_path);
  fclose(out);

  return 0;
}